

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O3

void __thiscall
TimedMutexTest_TryLockUntil_Test<yamc::alternate::timed_mutex>::~TimedMutexTest_TryLockUntil_Test
          (TimedMutexTest_TryLockUntil_Test<yamc::alternate::timed_mutex> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(TimedMutexTest, TryLockUntil)
{
  TypeParam mtx;
  std::size_t counter = 0;
  yamc::test::task_runner(
    TEST_THREADS,
    [&](std::size_t /*id*/) {
      for (std::size_t n = 0; n < TEST_ITERATION; ++n) {
        while (!mtx.try_lock_until(std::chrono::system_clock::now() + TEST_NOT_TIMEOUT)) {
          std::this_thread::yield();
        }
        std::lock_guard<TypeParam> lk(mtx, std::adopt_lock);
        counter = counter + 1;
      }
    });
  EXPECT_EQ(TEST_ITERATION * TEST_THREADS, counter);
}